

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<double>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  long lVar6;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  double local_6a8;
  char *local_698;
  char *local_690;
  MessageBuilder local_688;
  string local_508 [32];
  stringstream local_4e8 [8];
  stringstream ss_1;
  undefined1 local_4d8 [376];
  int local_360;
  allocator<char> local_359;
  GLint j_2;
  string result_str;
  stringstream local_318 [8];
  stringstream ss;
  undefined1 local_308 [376];
  int local_190;
  GLint j_1;
  allocator<char> local_179;
  string local_178 [8];
  string reference_str;
  int local_150;
  GLint i_2;
  GLint j;
  GLint i_1;
  double reference [8];
  double array_data [16];
  GLdouble scale;
  GLint i;
  double result [8];
  double *result_ptr;
  Functions *gl;
  bool normalized_local;
  GLint size_local;
  AttributeFormatTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x1680))(this->m_po);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar5 + 0x30))(0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar5 + 0x538))(0,0,2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar5 + 0x638))();
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  lVar6 = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  memset(&stack0xffffffffffffff88,0,0x40);
  for (scale._4_4_ = 0; SBORROW4(scale._4_4_,size * 2) != scale._4_4_ + size * -2 < 0;
      scale._4_4_ = scale._4_4_ + 1) {
    result[(long)scale._4_4_ + -1] = *(double *)(lVar6 + (long)scale._4_4_ * 8);
  }
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  local_6a8 = 0.0625;
  if (!normalized) {
    local_6a8 = 1.0;
  }
  reference[7] = local_6a8 * 0.0;
  memset(&j,0,0x40);
  for (i_2 = 0; i_2 < 2; i_2 = i_2 + 1) {
    for (local_150 = 0; local_150 < size; local_150 = local_150 + 1) {
      *(double *)(&j + (long)(i_2 * size + local_150) * 2) =
           reference[(long)(i_2 * size * 2 + local_150) + 7] +
           reference[(long)(i_2 * size * 2 + local_150 + size) + 7];
    }
  }
  reference_str.field_2._12_4_ = 0;
  while( true ) {
    if (SBORROW4(reference_str.field_2._12_4_,size * 2) ==
        reference_str.field_2._12_4_ + size * -2 < 0) {
      return true;
    }
    bVar1 = compare<double>(this,*(GLdouble *)(&j + (long)(int)reference_str.field_2._12_4_ * 2),
                            result[(long)(int)reference_str.field_2._12_4_ + -1]);
    if (!bVar1) break;
    reference_str.field_2._12_4_ = reference_str.field_2._12_4_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"[ ",&local_179);
  std::allocator<char>::~allocator(&local_179);
  for (local_190 = 0; SBORROW4(local_190,size * 2) != local_190 + size * -2 < 0;
      local_190 = local_190 + 1) {
    std::__cxx11::stringstream::stringstream(local_318);
    std::ostream::operator<<(local_308,*(double *)(&j + (long)local_190 * 2));
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append(local_178);
    std::__cxx11::string::~string((string *)(result_str.field_2._M_local_buf + 8));
    if (local_190 < size * 2 + -1) {
      std::__cxx11::string::append((char *)local_178);
    }
    else {
      std::__cxx11::string::append((char *)local_178);
    }
    std::__cxx11::stringstream::~stringstream(local_318);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&j_2,"[ ",&local_359);
  std::allocator<char>::~allocator(&local_359);
  for (local_360 = 0; SBORROW4(local_360,size * 2) != local_360 + size * -2 < 0;
      local_360 = local_360 + 1) {
    std::__cxx11::stringstream::stringstream(local_4e8);
    std::ostream::operator<<(local_4d8,result[(long)local_360 + -1]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)&j_2);
    std::__cxx11::string::~string(local_508);
    if (local_360 < size * 2 + -1) {
      std::__cxx11::string::append((char *)&j_2);
    }
    else {
      std::__cxx11::string::append((char *)&j_2);
    }
    std::__cxx11::stringstream::~stringstream(local_4e8);
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_688,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [27])"Result vector is equal to ");
  local_690 = (char *)std::__cxx11::string::c_str();
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_690);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a796ef);
  local_698 = (char *)std::__cxx11::string::c_str();
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_698);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])0x2a7d12b);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_688);
  std::__cxx11::string::~string((string *)&j_2);
  std::__cxx11::string::~string(local_178);
  return false;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}